

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

void __thiscall crnlib::adaptive_huffman_data_model::rescale(adaptive_huffman_data_model *this)

{
  int iVar1;
  unsigned_short *puVar2;
  uint local_18;
  uint freq;
  uint i;
  uint total_freq;
  adaptive_huffman_data_model *this_local;
  
  freq = 0;
  for (local_18 = 0; local_18 < this->m_total_syms; local_18 = local_18 + 1) {
    puVar2 = vector<unsigned_short>::operator[](&this->m_sym_freq,local_18);
    iVar1 = (int)(*puVar2 + 1) >> 1;
    freq = iVar1 + freq;
    puVar2 = vector<unsigned_short>::operator[](&this->m_sym_freq,local_18);
    *puVar2 = (unsigned_short)iVar1;
  }
  this->m_total_count = freq;
  return;
}

Assistant:

void adaptive_huffman_data_model::rescale()
    {
        uint total_freq = 0;

        for (uint i = 0; i < m_total_syms; i++)
        {
            uint freq = (m_sym_freq[i] + 1) >> 1;
            total_freq += freq;
            m_sym_freq[i] = static_cast<uint16>(freq);
        }

        m_total_count = total_freq;
    }